

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void find_suite::adjacent_find(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> input;
  iterator iVar1;
  iterator second_end;
  iterator iVar2;
  basic_iterator<int> first_end;
  allocator<int> local_13d;
  int local_13c [3];
  iterator local_130;
  size_type local_128;
  undefined1 local_120 [8];
  vector<int,_std::allocator<int>_> expect_1;
  allocator<int> local_c5;
  int local_c4;
  iterator local_c0;
  size_type local_b8;
  undefined1 local_b0 [8];
  vector<int,_std::allocator<int>_> expect;
  basic_iterator<int> where;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  where.current = 0x160000000b;
  input._M_len = 5;
  input._M_array = (iterator)&where.current;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::end
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  first_end = std::
              adjacent_find<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (iVar2,join_0x00000010_0x00000000_);
  local_c4 = 0x16;
  local_c0 = &local_c4;
  local_b8 = 1;
  std::allocator<int>::allocator(&local_c5);
  __l_00._M_len = local_b8;
  __l_00._M_array = local_c0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b0,__l_00,&local_c5);
  std::allocator<int>::~allocator(&local_c5);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_b0);
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_b0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x14b,"void find_suite::adjacent_find()",iVar2,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b0);
  local_13c[0] = 0x21;
  local_13c[1] = 0x21;
  local_13c[2] = 0x2c;
  local_130 = local_13c;
  local_128 = 3;
  std::allocator<int>::allocator(&local_13d);
  __l._M_len = local_128;
  __l._M_array = local_130;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_120,__l,&local_13d);
  std::allocator<int>::~allocator(&local_13d);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_120);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_120);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x150,"void find_suite::adjacent_find()",first_end,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_120);
  return;
}

Assistant:

void adjacent_find()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 33, 44 };
    auto where = std::adjacent_find(span.begin(), span.end());
    {
        std::vector<int> expect = { 22 };
        BOOST_TEST_ALL_EQ(span.begin(), where,
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> expect = { 33, 33, 44 };
        BOOST_TEST_ALL_EQ(where, span.end(),
                          expect.begin(), expect.end());
    }
}